

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,variable_statement *s)

{
  int iVar1;
  list *plVar2;
  value_type *pvVar3;
  const_reference this_00;
  wostream *pwVar4;
  wstring *ctx;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  value_type *d;
  size_t i;
  variable_statement *s_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,"var");
  d = (value_type *)0x0;
  while( true ) {
    plVar2 = variable_statement::l(s);
    pvVar3 = (value_type *)
             std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::size(plVar2);
    if (pvVar3 <= d) break;
    plVar2 = variable_statement::l(s);
    this_00 = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::operator[]
                        (plVar2,(size_type)d);
    pcVar5 = ") ";
    if (d != (value_type *)0x0) {
      pcVar5 = "], ";
    }
    pwVar4 = std::operator<<(this->os_,pcVar5 + 1);
    ctx = declaration::id_abi_cxx11_(this_00);
    std::operator<<(pwVar4,(wstring *)ctx);
    iVar1 = declaration::init(this_00,(EVP_PKEY_CTX *)ctx);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      pcVar5 = " = ";
      std::operator<<(this->os_," = ");
      iVar1 = declaration::init(this_00,(EVP_PKEY_CTX *)pcVar5);
      accept<mjs::print_visitor>((expression *)CONCAT44(extraout_var_00,iVar1),this);
    }
    d = (value_type *)&(d->id_).field_0x1;
  }
  std::operator<<(this->os_,';');
  return;
}

Assistant:

void operator()(const variable_statement& s) {
        os_ << "var";
        for (size_t i = 0; i < s.l().size(); ++i) {
            const auto& d = s.l()[i];
            os_ << (i ? ", ": " ") << d.id();
            if (d.init()) {
                os_ << " = ";
                accept(*d.init(), *this);
            }
        }
        os_ << ';';
    }